

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O3

int thrd_sleep(timespec *time_point,timespec *remaining)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  timespec now;
  timespec local_20;
  
  iVar2 = clock_gettime(0,&local_20);
  if (iVar2 != 0) {
    return -2;
  }
  uVar3 = ((time_point->tv_nsec - local_20.tv_nsec) + 500) / 1000 +
          (time_point->tv_sec - local_20.tv_sec) * 1000000;
  uVar4 = uVar3;
  if ((long)uVar3 < 1000000) {
    if ((long)uVar3 < 1) goto LAB_0011221c;
  }
  else {
    do {
      usleep(999999);
      uVar3 = uVar4 - 999999;
      bVar1 = 0x1e847e < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  usleep((__useconds_t)uVar3);
LAB_0011221c:
  if (remaining != (timespec *)0x0) {
    remaining->tv_sec = 0;
    remaining->tv_nsec = 0;
  }
  return 0;
}

Assistant:

int thrd_sleep(const struct timespec *time_point, struct timespec *remaining)
{
  struct timespec now;
#if defined(_TTHREAD_WIN32_)
  DWORD delta;
#else
  long delta;
#endif

  /* Get the current time */
  if (clock_gettime(CLOCK_REALTIME, &now) != 0)
    return -2;  // FIXME: Some specific error code?

#if defined(_TTHREAD_WIN32_)
  /* Delta in milliseconds */
  delta = (DWORD) ((time_point->tv_sec - now.tv_sec) * 1000 +
                   (time_point->tv_nsec - now.tv_nsec + 500000) / 1000000);
  if (delta > 0)
  {
    Sleep(delta);
  }
#else
  /* Delta in microseconds */
  delta = (time_point->tv_sec - now.tv_sec) * 1000000L +
          (time_point->tv_nsec - now.tv_nsec + 500L) / 1000L;

  /* On some systems, the usleep argument must be < 1000000 */
  while (delta > 999999L)
  {
    usleep(999999);
    delta -= 999999L;
  }
  if (delta > 0L)
  {
    usleep((useconds_t)delta);
  }
#endif

  /* We don't support waking up prematurely (yet) */
  if (remaining)
  {
    remaining->tv_sec = 0;
    remaining->tv_nsec = 0;
  }
  return 0;
}